

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O3

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  int iVar2;
  int32_t iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  uint *puVar13;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  byte bVar28;
  uint local_a0 [28];
  ulong uVar23;
  
  uVar9 = (ulong)(uint)start;
  bVar28 = 0;
  if (start + 1 < end) {
    uVar21 = end - 1;
    uVar23 = (ulong)uVar21;
    uVar24 = uVar21 - start;
    if (0x18 < (int)uVar24) {
LAB_005746c3:
      uVar21 = (uint)uVar9;
      iVar25 = (uVar24 >> 1) + uVar21;
      pNVar1 = keys + iVar25;
      iVar25 = keys[iVar25].idx;
      uVar22 = (uint)uVar23;
      lVar8 = (long)(int)uVar22;
      lVar26 = (long)(int)uVar21;
      uVar11 = uVar9;
      uVar20 = uVar23;
      do {
        iVar17 = (int)uVar11;
        iVar16 = (int)uVar20;
        if ((type & 1U) == 0) {
          if (iVar17 < (int)uVar22) {
            piVar10 = &keys[iVar17].idx;
            lVar27 = 0;
            do {
              bVar6 = EQ(*piVar10,iVar25);
              if ((!bVar6) && (iVar25 <= *piVar10)) {
                uVar11 = (ulong)(uint)(iVar17 - (int)lVar27);
                break;
              }
              lVar27 = lVar27 + -1;
              piVar10 = piVar10 + 0x21;
              uVar11 = uVar23;
            } while ((long)iVar17 + -lVar8 != lVar27);
          }
          if ((int)uVar21 < iVar16) {
            uVar19 = (ulong)iVar16;
            piVar10 = &keys[uVar19].idx;
            do {
              bVar6 = EQ(*piVar10,iVar25);
              uVar20 = uVar19;
              if ((bVar6) || (*piVar10 < iVar25)) break;
              uVar19 = uVar19 - 1;
              piVar10 = piVar10 + -0x21;
              uVar20 = uVar9;
            } while (lVar26 < (long)uVar19);
          }
        }
        else {
          if (iVar17 < (int)uVar22) {
            piVar10 = &keys[iVar17].idx;
            lVar27 = 0;
            do {
              bVar6 = EQ(*piVar10,iVar25);
              if ((bVar6) || (iVar25 <= *piVar10)) {
                uVar11 = (ulong)(uint)(iVar17 - (int)lVar27);
                break;
              }
              lVar27 = lVar27 + -1;
              piVar10 = piVar10 + 0x21;
              uVar11 = uVar23;
            } while ((long)iVar17 + -lVar8 != lVar27);
          }
          if ((int)uVar21 < iVar16) {
            uVar19 = (ulong)iVar16;
            piVar10 = &keys[uVar19].idx;
            do {
              bVar6 = EQ(*piVar10,iVar25);
              if ((!bVar6) && (uVar20 = uVar19, *piVar10 < iVar25)) break;
              uVar19 = uVar19 - 1;
              piVar10 = piVar10 + -0x21;
              uVar20 = uVar9;
            } while (lVar26 < (long)uVar19);
          }
        }
        uVar24 = (uint)uVar11;
        iVar17 = (int)uVar20;
        if (iVar17 <= (int)uVar24) goto LAB_00574930;
        pNVar12 = keys + (int)uVar24;
        puVar13 = local_a0;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          *puVar13 = (pNVar12->val).m_backend.data._M_elems[0];
          pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
          puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
        }
        iVar16 = keys[(int)uVar24].val.m_backend.exp;
        bVar6 = keys[(int)uVar24].val.m_backend.neg;
        iVar2 = keys[(int)uVar24].idx;
        pNVar12 = keys + iVar17;
        pNVar14 = keys + (int)uVar24;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pNVar14->val).m_backend.data._M_elems[0] = (pNVar12->val).m_backend.data._M_elems[0];
          pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
          pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar14 + (ulong)bVar28 * -8 + 4);
        }
        keys[(int)uVar24].val.m_backend.exp = keys[iVar17].val.m_backend.exp;
        keys[(int)uVar24].val.m_backend.neg = keys[iVar17].val.m_backend.neg;
        keys[(int)uVar24].idx = keys[iVar17].idx;
        puVar13 = local_a0;
        pNVar12 = keys + iVar17;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pNVar12->val).m_backend.data._M_elems[0] = *puVar13;
          puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
          pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
        }
        keys[iVar17].val.m_backend.exp = iVar16;
        keys[iVar17].val.m_backend.neg = bVar6;
        fVar4 = keys[(int)uVar24].val.m_backend.fpclass;
        iVar5 = keys[(int)uVar24].val.m_backend.prec_elem;
        iVar3 = keys[iVar17].val.m_backend.prec_elem;
        keys[(int)uVar24].val.m_backend.fpclass = keys[iVar17].val.m_backend.fpclass;
        keys[(int)uVar24].val.m_backend.prec_elem = iVar3;
        keys[iVar17].val.m_backend.fpclass = fVar4;
        keys[iVar17].val.m_backend.prec_elem = iVar5;
        keys[iVar17].idx = iVar2;
        uVar11 = (ulong)(uVar24 + 1);
        uVar20 = (ulong)(iVar17 - 1);
      } while( true );
    }
LAB_00574bc3:
    if (0 < (int)uVar24) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,uVar21,compare,start);
      return;
    }
  }
  return;
LAB_00574930:
  if ((type & 1U) == 0) {
    if ((int)uVar21 < iVar17) {
      uVar19 = (ulong)iVar17;
      piVar10 = &keys[uVar19].idx;
      do {
        bVar6 = EQ(iVar25,*piVar10);
        if ((!bVar6) && (uVar20 = uVar19, *piVar10 <= iVar25)) break;
        uVar19 = uVar19 - 1;
        piVar10 = piVar10 + -0x21;
        uVar20 = uVar9;
      } while (lVar26 < (long)uVar19);
    }
    if ((uint)uVar20 != uVar22) goto LAB_00574b55;
    pNVar12 = keys + lVar8;
    puVar13 = local_a0;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      *puVar13 = (pNVar12->val).m_backend.data._M_elems[0];
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
    }
    iVar25 = keys[lVar8].val.m_backend.exp;
    bVar6 = keys[lVar8].val.m_backend.neg;
    iVar17 = keys[lVar8].idx;
    pNVar12 = pNVar1;
    pNVar14 = keys + lVar8;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pNVar14->val).m_backend.data._M_elems[0] = (pNVar12->val).m_backend.data._M_elems[0];
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
      pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pNVar14 + (ulong)bVar28 * -8 + 4);
    }
    keys[lVar8].val.m_backend.exp = (pNVar1->val).m_backend.exp;
    keys[lVar8].val.m_backend.neg = (pNVar1->val).m_backend.neg;
    keys[lVar8].idx = pNVar1->idx;
    puVar13 = local_a0;
    pNVar12 = pNVar1;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pNVar12->val).m_backend.data._M_elems[0] = *puVar13;
      puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
    }
    (pNVar1->val).m_backend.exp = iVar25;
    (pNVar1->val).m_backend.neg = bVar6;
    fVar4 = keys[lVar8].val.m_backend.fpclass;
    iVar5 = keys[lVar8].val.m_backend.prec_elem;
    iVar3 = (pNVar1->val).m_backend.prec_elem;
    keys[lVar8].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
    keys[lVar8].val.m_backend.prec_elem = iVar3;
    (pNVar1->val).m_backend.fpclass = fVar4;
    (pNVar1->val).m_backend.prec_elem = iVar5;
    pNVar1->idx = iVar17;
    uVar20 = (ulong)(uVar22 - 1);
  }
  else {
    uVar18 = uVar24;
    if ((int)uVar24 < (int)uVar22) {
      piVar10 = &keys[(int)uVar24].idx;
      lVar27 = 0;
      do {
        bVar6 = EQ(iVar25,*piVar10);
        if ((!bVar6) && (iVar25 < *piVar10)) {
          uVar18 = uVar24 - (int)lVar27;
          break;
        }
        lVar27 = lVar27 + -1;
        piVar10 = piVar10 + 0x21;
        uVar18 = uVar22;
      } while ((int)uVar24 - lVar8 != lVar27);
    }
    uVar24 = uVar18;
    if (uVar24 == uVar21) {
      pNVar12 = keys + lVar26;
      puVar13 = local_a0;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar13 = (pNVar12->val).m_backend.data._M_elems[0];
        pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
        puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
      }
      iVar25 = keys[lVar26].val.m_backend.exp;
      bVar6 = keys[lVar26].val.m_backend.neg;
      iVar17 = keys[lVar26].idx;
      pNVar12 = pNVar1;
      pNVar14 = keys + lVar26;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pNVar14->val).m_backend.data._M_elems[0] = (pNVar12->val).m_backend.data._M_elems[0];
        pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
        pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar14 + (ulong)bVar28 * -8 + 4);
      }
      keys[lVar26].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[lVar26].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[lVar26].idx = pNVar1->idx;
      puVar13 = local_a0;
      pNVar12 = pNVar1;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pNVar12->val).m_backend.data._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar28 * -2 + 1;
        pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar12 + (ulong)bVar28 * -8 + 4);
      }
      (pNVar1->val).m_backend.exp = iVar25;
      (pNVar1->val).m_backend.neg = bVar6;
      fVar4 = keys[lVar26].val.m_backend.fpclass;
      iVar5 = keys[lVar26].val.m_backend.prec_elem;
      iVar3 = (pNVar1->val).m_backend.prec_elem;
      keys[lVar26].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[lVar26].val.m_backend.prec_elem = iVar3;
      (pNVar1->val).m_backend.fpclass = fVar4;
      (pNVar1->val).m_backend.prec_elem = iVar5;
      pNVar1->idx = iVar17;
      uVar11 = (ulong)(uVar21 + 1);
    }
    else {
LAB_00574b55:
      uVar11 = (ulong)uVar24;
    }
  }
  uVar18 = (uint)uVar20;
  uVar7 = uVar18 - uVar21;
  uVar15 = (uint)uVar11;
  uVar24 = uVar22 - uVar15;
  if ((int)uVar24 < (int)uVar7) {
    uVar23 = uVar20 & 0xffffffff;
    uVar11 = uVar9;
    uVar24 = uVar7;
    uVar18 = uVar22;
    uVar21 = uVar15;
    if ((int)uVar22 <= (int)uVar15) goto LAB_00574b9b;
  }
  else {
    uVar9 = uVar11;
    if ((int)uVar18 <= (int)uVar21) goto LAB_00574b9b;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar18 + 1,compare,uVar21,(bool)(~type & 1));
  uVar9 = uVar11;
LAB_00574b9b:
  uVar21 = (uint)uVar23;
  start = (int)uVar9;
  type = (bool)(type ^ 1);
  if ((int)uVar24 < 0x19) goto LAB_00574bc3;
  goto LAB_005746c3;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}